

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O2

void __thiscall List<String>::merge(List<String> *this,List<String> *other)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  _Self local_c8;
  _Deque_iterator<String,_const_String_&,_const_String_*> local_a8;
  _Deque_iterator<String,_const_String_&,_const_String_*> local_88;
  _Deque_iterator<String,_String_&,_String_*> local_68;
  _Self local_48;
  
  sVar1 = std::deque<String,_std::allocator<String>_>::size(&this->_deque);
  sVar2 = std::deque<String,_std::allocator<String>_>::size(&this->_deque);
  sVar3 = std::deque<String,_std::allocator<String>_>::size(&other->_deque);
  resize(this,(int)sVar2 + (int)sVar3);
  local_88._M_cur =
       (other->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_88._M_first =
       (other->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_88._M_last =
       (other->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_88._M_node =
       (other->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_a8._M_cur =
       (other->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_finish._M_cur;
  local_a8._M_first =
       (other->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_finish._M_first;
  local_a8._M_last =
       (other->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_finish._M_last;
  local_a8._M_node =
       (other->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_finish._M_node;
  local_c8._M_cur =
       (this->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_c8._M_first =
       (this->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_c8._M_last =
       (this->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_c8._M_node =
       (this->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  std::operator+(&local_48,&local_c8,(long)(int)sVar1);
  std::
  copy<std::_Deque_iterator<String,String_const&,String_const*>,std::_Deque_iterator<String,String&,String*>>
            (&local_68,&local_88,&local_a8,&local_48);
  return;
}

Assistant:

void List<T>::merge (const List<T>& other)
{
	int oldsize = size();
	resize (size() + other.size());
	std::copy (other.begin(), other.end(), begin() + oldsize);
}